

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_impl.cpp
# Opt level: O2

bool __thiscall raspicam::_private::Private_Impl::startCapture(Private_Impl *this)

{
  MMAL_STATUS_T MVar1;
  uint uVar2;
  MMAL_BUFFER_HEADER_T *buffer;
  ostream *poVar3;
  uint uVar4;
  
  if (this->_isOpened == false) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rmsalinas[P]raspicam/src/private/private_impl.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x77);
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = std::operator<<(poVar3,"startCapture");
    poVar3 = std::operator<<(poVar3," not opened.");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    MVar1 = mmal_port_parameter_set_boolean(this->camera_video_port,0x10011,1);
    if (MVar1 == MMAL_SUCCESS) {
      uVar2 = mmal_queue_length(((this->State).video_pool)->queue);
      uVar4 = 0;
      if ((int)uVar2 < 1) {
        uVar2 = 0;
      }
      for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
        buffer = mmal_queue_get(((this->State).video_pool)->queue);
        if (buffer == (MMAL_BUFFER_HEADER_T *)0x0) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"Unable to get a required buffer");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar4);
          poVar3 = std::operator<<(poVar3," from pool queue");
          std::endl<char,std::char_traits<char>>(poVar3);
        }
        MVar1 = mmal_port_send_buffer(this->camera_video_port,buffer);
        if (MVar1 != MMAL_SUCCESS) {
          poVar3 = std::operator<<((ostream *)&std::cerr,
                                   "Unable to send a buffer to encoder output port ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar4);
          std::endl<char,std::char_traits<char>>(poVar3);
        }
      }
      this->_isCapturing = true;
      return true;
    }
    release(this);
  }
  return false;
}

Assistant:

bool Private_Impl::startCapture() {
            if ( !_isOpened ) {
                cerr<<__FILE__<<":"<<__LINE__<<":"<<__func__<<" not opened."<<endl;
                return false; //already opened
            }

            // start capture
            if ( mmal_port_parameter_set_boolean ( camera_video_port, MMAL_PARAMETER_CAPTURE, 1 ) != MMAL_SUCCESS ) {
                release();
                return false;
            }
            // Send all the buffers to the video port

            int num = mmal_queue_length ( State.video_pool->queue );
            int q;
            for ( q=0; q<num; q++ ) {
                MMAL_BUFFER_HEADER_T *buffer = mmal_queue_get ( State.video_pool->queue );

                if ( !buffer )
                    cerr<<"Unable to get a required buffer"<<q<<" from pool queue"<<endl;

                if ( mmal_port_send_buffer ( camera_video_port, buffer ) != MMAL_SUCCESS )
                    cerr<<"Unable to send a buffer to encoder output port "<< q<<endl;
            }
            _isCapturing=true;
            return true;
        }